

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_HistoryRecord::SetObjRefValues(ON_HistoryRecord *this,int value_id,int count,ON_ObjRef *oref)

{
  ON_ClassArray<ON_ObjRef> *this_00;
  undefined8 *puVar1;
  ON_UuidList *this_01;
  bool bVar2;
  ON_UUID uuid;
  bool bVar3;
  ON_Value *pOVar4;
  ulong uVar5;
  ON_ObjRef *this_02;
  long lVar6;
  ON_ObjRef_IRefID *pOVar7;
  ulong uVar8;
  int r;
  long lVar9;
  ON_UUID uuid_00;
  ON_UUID object_id;
  
  pOVar4 = FindValueHelper(this,value_id,9,true);
  if (pOVar4 != (ON_Value *)0x0) {
    this_00 = (ON_ClassArray<ON_ObjRef> *)(pOVar4 + 1);
    ON_ClassArray<ON_ObjRef>::Destroy(this_00);
    ON_ClassArray<ON_ObjRef>::Reserve(this_00,(long)count);
    if (count != 0) {
      uVar8 = 0;
      if (oref == (ON_ObjRef *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = 0 < (oref->m__iref).m_count;
      }
      this_01 = &this->m_antecedents;
      uVar5 = (ulong)(uint)count;
      if (count < 1) {
        uVar5 = uVar8;
      }
      for (; uVar5 * 0xe0 - uVar8 != 0; uVar8 = uVar8 + 0xe0) {
        this_02 = ON_ClassArray<ON_ObjRef>::AppendNew(this_00);
        ON_ObjRef::operator=(this_02,(ON_ObjRef *)((oref->m_uuid).Data4 + (uVar8 - 8)));
        ON_ObjRef::DecrementProxyReferenceCount(this_02);
        this_02->m_runtime_sn = 0;
        if (!bVar2) {
          puVar1 = (undefined8 *)(*(long *)&pOVar4[1].m_value_id + uVar8);
          object_id._0_8_ = *puVar1;
          object_id.Data4 = *(uchar (*) [8])(puVar1 + 1);
          bVar3 = ON_UuidIsNil(&object_id);
          if (!bVar3) {
            uuid.Data4[0] = object_id.Data4[0];
            uuid.Data4[1] = object_id.Data4[1];
            uuid.Data4[2] = object_id.Data4[2];
            uuid.Data4[3] = object_id.Data4[3];
            uuid.Data4[4] = object_id.Data4[4];
            uuid.Data4[5] = object_id.Data4[5];
            uuid.Data4[6] = object_id.Data4[6];
            uuid.Data4[7] = object_id.Data4[7];
            uuid.Data1 = object_id.Data1;
            uuid.Data2 = object_id.Data2;
            uuid.Data3 = object_id.Data3;
            ON_UuidList::AddUuid(this_01,uuid,true);
          }
        }
      }
      if (bVar2) {
        lVar6 = (long)(oref->m__iref).m_count;
        pOVar7 = (oref->m__iref).m_a + lVar6;
        if (pOVar7 != (ON_ObjRef_IRefID *)0x190 && 0 < lVar6) {
          ON_UuidList::AddUuid(this_01,pOVar7[-1].m_iref_uuid,true);
        }
        lVar6 = 0x98;
        for (lVar9 = 0; lVar9 < (oref->m__iref).m_count; lVar9 = lVar9 + 1) {
          pOVar7 = (oref->m__iref).m_a;
          uuid_00.Data4 = *(uchar (*) [8])((pOVar7->m_iref_uuid).Data4 + lVar6 + -8);
          uuid_00._0_8_ = *(undefined8 *)((pOVar7->m_iref_uuid).Data4 + lVar6 + -0x10);
          ON_UuidList::AddUuid(this_01,uuid_00,true);
          lVar6 = lVar6 + 400;
        }
      }
    }
  }
  return pOVar4 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetObjRefValues( int value_id, int count, const ON_ObjRef* oref)
{
  ON_ObjRefValue* v = static_cast<ON_ObjRefValue*>(FindValueHelper(value_id,ON_Value::objref_value,true));
  if ( v )
  {
    v->m_value.Destroy();
    v->m_value.Reserve(count);

    if(count)
    {
      // 2019-01-23 - kike@mcneel.com
      // Objects in instance definitions can not be modified in that case
      // I add the root instance reference and all the instance definitions as 'antecedents'
      const bool idef_geometry = oref && (oref->m__iref.Count() > 0);

      for(int i = 0; i < count; i++)
      {
        // The call to DecrementProxyReferenceCount() is critical.
        // It makes sure there are no active runtime pointers 
        // saved in the history record.  If this call is not here,
        // you will eventually crash and history update will never
        // work right even when it doesn't crash.
        ON_ObjRef& vor = v->m_value.AppendNew();
        vor = oref[i];
        vor.DecrementProxyReferenceCount();
        // Feb 12 2010 - Fixing bug in ExtrudeCrv history
        //  and probably lots of other subtle history bugs.
        //  History must lookup by UUID and not by runtime serial number.
        vor.m_runtime_sn = 0;

        // 2019-01-23 - kike@mcneel.com
        if(!idef_geometry)
        {
          ON_UUID object_id = v->m_value[i].m_uuid;
          if(!ON_UuidIsNil(object_id))
          {
            m_antecedents.AddUuid(object_id);
          }
        }
      }

      // 2019-01-23 - kike@mcneel.com
      if(idef_geometry)
      {
        if(auto iref = oref->m__iref.Last())
          m_antecedents.AddUuid(iref->m_iref_uuid);

        for(int r = 0; r < oref->m__iref.Count(); ++r)
          m_antecedents.AddUuid(oref->m__iref[r].m_idef_uuid);
      }
    }
  }
  return (0 != v);
}